

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0035(TypeCanonicalizerAndResolverTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  allocator<char> local_371;
  string local_370;
  Decl local_350;
  Decl local_288;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCanonicalizerAndResolverTester *this_local;
  
  local_18 = 
  "\ntypedef const double x ;\ntypedef x y ;\ntypedef y z ;\ntypedef z w ;\nconst w p ;\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "\ntypedef const double x ;\ntypedef x y ;\ntypedef y z ;\ntypedef z w ;\nconst w p ;\n"
             ,&local_39);
  Expectation::Expectation(&local_1c0);
  Decl::Decl(&local_350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"p",&local_371);
  pDVar1 = Decl::Object(&local_350,&local_370,VariableDeclaration,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Double,Const);
  Decl::Decl(&local_288,pDVar1);
  pEVar2 = Expectation::declaration(&local_1c0,&local_288);
  Expectation::Expectation(&local_108,pEVar2);
  canonicalizerAndResolveTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  Decl::~Decl(&local_288);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  Decl::~Decl(&local_350);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0035()
{
    auto s = R"(
typedef const double x ;
typedef x y ;
typedef y z ;
typedef z w ;
const w p ;
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .declaration(Decl()
                         .Object("p", SymbolKind::VariableDeclaration)
                         .ty_.Basic(BasicTypeKind::Double, CVR::Const)));
}